

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview_p.h
# Opt level: O2

QBitArray * __thiscall
QHeaderViewPrivate::sectionsHiddenToBitVector
          (QBitArray *__return_storage_ptr__,QHeaderViewPrivate *this)

{
  Data *pDVar1;
  int u;
  ulong uVar2;
  long in_FS_OFFSET;
  QBitRef local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d.size = 0;
  (__return_storage_ptr__->d).d.d = (Data *)0x0;
  (__return_storage_ptr__->d).d.ptr = (char *)0x0;
  pDVar1 = (this->hiddenSectionSize).d;
  if ((pDVar1 != (Data *)0x0) && (pDVar1->size != 0)) {
    QBitArray::resize((longlong)__return_storage_ptr__);
    for (uVar2 = 0; uVar2 < (ulong)(this->sectionItems).d.size; uVar2 = uVar2 + 1) {
      local_38.a = __return_storage_ptr__;
      local_38.i = uVar2;
      QBitRef::operator=(&local_38,
                         (bool)((byte)(*(uint *)((this->sectionItems).d.ptr + uVar2) >> 0x14) & 1));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QBitArray sectionsHiddenToBitVector() const
    {
        QBitArray sectionHidden;
        if (!hiddenSectionSize.isEmpty()) {
            sectionHidden.resize(sectionItems.size());
            for (int u = 0; u < sectionItems.size(); ++u)
                sectionHidden[u] = sectionItems.at(u).isHidden;
        }
        return sectionHidden;
    }